

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall
cmCPackIFWResourcesParser::CharacterDataHandler
          (cmCPackIFWResourcesParser *this,char *data,int length)

{
  bool bVar1;
  string destination;
  string content;
  string source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->file == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,data,data + length);
    cmSystemTools::TrimWhitespace(&local_50,&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_90,&this->basePath,"/");
    std::operator+(&local_50,&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_30,&this->path,"/");
    std::operator+(&local_90,&local_30,&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = cmsys::SystemTools::CopyFileIfDifferent(&local_50,&local_90);
    if (!bVar1) {
      this->hasErrors = true;
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) override
  {
    if (this->file) {
      std::string content(data, data + length);
      content = cmSystemTools::TrimWhitespace(content);
      std::string source = this->basePath + "/" + content;
      std::string destination = this->path + "/" + content;
      if (!cmSystemTools::CopyFileIfDifferent(source, destination)) {
        this->hasErrors = true;
      }
    }
  }